

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DatatypeValidator::setTypeName(DatatypeValidator *this,XMLCh *name,XMLCh *uri)

{
  int iVar1;
  XMLSize_t XVar2;
  XMLSize_t XVar3;
  undefined4 extraout_var;
  XMLSize_t uriLen;
  XMLSize_t nameLen;
  XMLCh *uri_local;
  XMLCh *name_local;
  DatatypeValidator *this_local;
  
  if (this->fTypeName != (XMLCh *)0x0) {
    (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fTypeName);
    this->fTypeName = (XMLCh *)0x0;
  }
  if ((name == (XMLCh *)0x0) && (uri == (XMLCh *)0x0)) {
    this->fTypeLocalName = L"";
    this->fTypeUri = L"";
  }
  else {
    XVar2 = XMLString::stringLen(name);
    XVar3 = XMLString::stringLen(uri);
    iVar1 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                      (this->fMemoryManager,(XVar2 + XVar3 + 2) * 2);
    this->fTypeName = (XMLCh *)CONCAT44(extraout_var,iVar1);
    this->fTypeUri = this->fTypeName;
    this->fTypeLocalName = this->fTypeName + XVar3 + 1;
    if (uri == (XMLCh *)0x0) {
      *this->fTypeName = L'\0';
    }
    else {
      XMLString::moveChars(this->fTypeName,uri,XVar3 + 1);
    }
    if (name == (XMLCh *)0x0) {
      this->fTypeName[XVar3 + 1] = L'\0';
    }
    else {
      XMLString::moveChars(this->fTypeName + XVar3 + 1,name,XVar2 + 1);
    }
  }
  return;
}

Assistant:

void DatatypeValidator::setTypeName(const XMLCh* const name, const XMLCh* const uri)
{
    if (fTypeName) {

        fMemoryManager->deallocate(fTypeName);
        fTypeName = 0;
    }

    if (name || uri) {

        XMLSize_t nameLen = XMLString::stringLen(name);
        XMLSize_t uriLen = XMLString::stringLen(uri);

        fTypeName = (XMLCh*) fMemoryManager->allocate
        (
            (nameLen + uriLen + 2)*sizeof(XMLCh)
        );
        fTypeUri = fTypeName;
        fTypeLocalName = &fTypeName[uriLen+1];

        if (uri)
			XMLString::moveChars(fTypeName, uri, uriLen+1);
        else
			fTypeName[0] = chNull;

        if (name)
            XMLString::moveChars(&fTypeName[uriLen+1], name, nameLen+1);
        else
            fTypeName[uriLen+1] = chNull;
    }
    else
    {
        fTypeUri = fTypeLocalName = XMLUni::fgZeroLenString;
    }
}